

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O2

void __thiscall
ConfidentialTxIn_ConstractorEmpty_Test::TestBody(ConfidentialTxIn_ConstractorEmpty_Test *this)

{
  char *pcVar1;
  AssertHelper local_188;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  AssertionResult gtest_ar;
  ConfidentialTxIn txin1;
  
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&txin1);
  local_180.ptr_._0_4_ = cfd::core::AbstractTxIn::GetVout(&txin1.super_AbstractTxIn);
  local_188.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"txin1.GetVout()","0",(uint *)&local_180,(int *)&local_188);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_180);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x41,pcVar1);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_180);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_180.ptr_._0_4_ = cfd::core::AbstractTxIn::GetSequence(&txin1.super_AbstractTxIn);
  local_188.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"txin1.GetSequence()","0",(uint *)&local_180,(int *)&local_188);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_180);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x42,pcVar1);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_180);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&txin1);
  return;
}

Assistant:

TEST(ConfidentialTxIn, ConstractorEmpty) {
  ConfidentialTxIn txin1;
  EXPECT_EQ(txin1.GetVout(), 0);
  EXPECT_EQ(txin1.GetSequence(), 0);
}